

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

GestureType QScroller::grabGesture(QObject *target,ScrollerGestureType scrollGestureType)

{
  bool bVar1;
  QScroller *pQVar2;
  QFlickGestureRecognizer *pQVar3;
  QGraphicsObject *pQVar4;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsObject *go;
  QWidget *widget;
  MouseButton button;
  QScrollerPrivate *sp;
  QScroller *s;
  MouseButton in_stack_ffffffffffffff7c;
  QWidget *in_stack_ffffffffffffff80;
  GestureType in_stack_ffffffffffffff88;
  QFlagsStorage<Qt::GestureFlag> in_stack_ffffffffffffff8c;
  QGraphicsObject *in_stack_ffffffffffffff90;
  GestureType in_stack_ffffffffffffff98;
  QFlagsStorage<Qt::GestureFlag> in_stack_ffffffffffffff9c;
  QObject *in_stack_ffffffffffffffc8;
  QScrollerPrivate *pQVar5;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  GestureType GVar6;
  undefined1 local_10 [4];
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = scroller(in_stack_ffffffffffffffc8);
  if (pQVar2 == (QScroller *)0x0) {
    GVar6 = ~LastGestureType;
  }
  else {
    pQVar5 = pQVar2->d_ptr;
    if (pQVar5->recognizer != (QFlickGestureRecognizer *)0x0) {
      ungrabGesture(&in_stack_ffffffffffffff90->super_QObject);
    }
    switch(in_ESI) {
    default:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
    }
    pQVar3 = (QFlickGestureRecognizer *)operator_new(0x10);
    QFlickGestureRecognizer::QFlickGestureRecognizer
              ((QFlickGestureRecognizer *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    pQVar5->recognizer = pQVar3;
    GVar6 = QGestureRecognizer::registerRecognizer((QGestureRecognizer *)0xa80849);
    pQVar5->recognizerType = GVar6;
    bVar1 = QObject::isWidgetType((QObject *)0xa8085d);
    if (bVar1) {
      memset(local_c,0,4);
      QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0xa8089e);
      QWidget::grabGesture
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
                 (GestureFlags)in_stack_ffffffffffffff8c.i);
      if (in_ESI == 0) {
        QWidget::setAttribute
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                   (WidgetAttribute)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      }
    }
    else {
      pQVar4 = qobject_cast<QGraphicsObject*>((QObject *)0xa808d7);
      if (pQVar4 != (QGraphicsObject *)0x0) {
        if (in_ESI == 0) {
          QGraphicsItem::setAcceptTouchEvents
                    ((QGraphicsItem *)in_stack_ffffffffffffff90,
                     SUB41(in_stack_ffffffffffffff8c.i >> 0x18,0));
        }
        memset(local_10,0,4);
        QFlags<Qt::GestureFlag>::QFlags((QFlags<Qt::GestureFlag> *)0xa8092f);
        QGraphicsObject::grabGesture
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,
                   (GestureFlags)in_stack_ffffffffffffff9c.i);
      }
    }
    GVar6 = pQVar5->recognizerType;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return GVar6;
  }
  __stack_chk_fail();
}

Assistant:

Qt::GestureType QScroller::grabGesture(QObject *target, ScrollerGestureType scrollGestureType)
{
    // ensure that a scroller for target is created
    QScroller *s = scroller(target);
    if (!s)
        return Qt::GestureType(0);

    QScrollerPrivate *sp = s->d_ptr;
    if (sp->recognizer)
        ungrabGesture(target); // ungrab the old gesture

    Qt::MouseButton button;
    switch (scrollGestureType) {
    case LeftMouseButtonGesture  : button = Qt::LeftButton; break;
    case RightMouseButtonGesture : button = Qt::RightButton; break;
    case MiddleMouseButtonGesture: button = Qt::MiddleButton; break;
    default                      :
    case TouchGesture            : button = Qt::NoButton; break; // NoButton == Touch
    }

    sp->recognizer = new QFlickGestureRecognizer(button);
    sp->recognizerType = QGestureRecognizer::registerRecognizer(sp->recognizer);

    if (target->isWidgetType()) {
        QWidget *widget = static_cast<QWidget *>(target);
        widget->grabGesture(sp->recognizerType);
        if (scrollGestureType == TouchGesture)
            widget->setAttribute(Qt::WA_AcceptTouchEvents);
#if QT_CONFIG(graphicsview)
    } else if (QGraphicsObject *go = qobject_cast<QGraphicsObject*>(target)) {
        if (scrollGestureType == TouchGesture)
            go->setAcceptTouchEvents(true);
        go->grabGesture(sp->recognizerType);
#endif // QT_CONFIG(graphicsview)
    }
    return sp->recognizerType;
}